

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O2

sexp_conflict
sexp_lgamma_r_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  sexp_conflict psVar1;
  sexp_conflict res1;
  sexp_conflict res;
  int tmp1;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  res = (sexp_conflict)0x43e;
  res1 = (sexp_conflict)0x43e;
  if ((((ulong)arg0 & 3) == 0) && (arg0->tag == 0xb)) {
    local_48.next = &local_38;
    local_38.next = (ctx->value).context.saves;
    local_48.var = &res1;
    (ctx->value).context.saves = &local_48;
    local_38.var = &res;
    lgamma_r((arg0->value).flonum,&tmp1);
    res = (sexp_conflict)sexp_make_flonum(ctx);
    res1 = (sexp_conflict)sexp_make_integer(ctx,(long)tmp1,(long)(tmp1 >> 0x1f));
    res = (sexp_conflict)sexp_cons_op(ctx,0,2,res,0x23e);
    sexp_push_op(ctx,&res,(res->value).flonum);
    (((res->value).type.cpl)->value).type.name = res1;
    (ctx->value).context.saves = local_38.next;
    return res;
  }
  psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,0xb);
  return psVar1;
}

Assistant:

sexp sexp_lgamma_r_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  int tmp1;
  sexp_gc_var2(res, res1);
  if (! sexp_flonump(arg0))
    return sexp_type_exception(ctx, self, SEXP_FLONUM, arg0);
  sexp_gc_preserve2(ctx, res, res1);
  res = sexp_make_flonum(ctx, lgamma_r(sexp_flonum_value(arg0), &tmp1));
  res1 = sexp_make_integer(ctx, tmp1);
  res = sexp_cons(ctx, res, SEXP_NULL);
  sexp_push(ctx, res, sexp_car(res));
  sexp_cadr(res) = res1;
  sexp_gc_release2(ctx);
  return res;
}